

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nonius.hpp
# Opt level: O1

void __thiscall
nonius::standard_reporter::print_outlier_count
          (standard_reporter *this,char *description,int count,int total)

{
  basic_ostream<char,_std::char_traits<char>_> *this_00;
  ostream *poVar1;
  size_t sVar2;
  detail *this_01;
  string local_40;
  
  if (0 < count) {
    if ((this->super_reporter).os.super__Function_base._M_manager == (_Manager_type)0x0) {
      std::__throw_bad_function_call();
    }
    this_00 = (*(this->super_reporter).os._M_invoker)((_Any_data *)&(this->super_reporter).os);
    std::__ostream_insert<char,std::char_traits<char>>(this_00,"  ",2);
    poVar1 = (ostream *)std::ostream::operator<<((ostream *)this_00,count);
    this_01 = (detail *)0x16c52b;
    std::__ostream_insert<char,std::char_traits<char>>(poVar1," (",2);
    detail::percentage_abi_cxx11_(&local_40,this_01,(double)count / (double)total);
    poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar1,local_40._M_dataplus._M_p,local_40._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar1,") ",2);
    if (description == (char *)0x0) {
      std::ios::clear((int)poVar1 + (int)*(undefined8 *)(*(long *)poVar1 + -0x18));
    }
    else {
      sVar2 = strlen(description);
      std::__ostream_insert<char,std::char_traits<char>>(poVar1,description,sVar2);
    }
    std::__ostream_insert<char,std::char_traits<char>>(poVar1,"\n",1);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_40._M_dataplus._M_p != &local_40.field_2) {
      operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity + 1);
    }
  }
  return;
}

Assistant:

void print_outlier_count(const char* description, int count, int total) {
            if(count > 0) report_stream() << "  " << count << " (" << detail::percentage_ratio(count, total) << ") " << description << "\n";
        }